

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrCPY0xcc(CPU *this)

{
  uint8_t reg;
  uint8_t argument;
  
  reg = this->Y;
  argument = absolute_addr(this);
  CMP(this,reg,argument);
  return 4;
}

Assistant:

int CPU::instrCPY0xcc() {
	CMP(Y, absolute_addr());
	return 4;
}